

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddReorder.c
# Opt level: O0

int Cudd_ReduceHeap(DdManager *table,Cudd_ReorderingType heuristic,int minsize)

{
  double dVar1;
  int iVar2;
  uint uVar3;
  void *pvVar4;
  abctime aVar5;
  int res_1;
  double saveGrowth;
  int res;
  long localTime;
  uint nextDyn;
  int result;
  DdHook *hook;
  int minsize_local;
  Cudd_ReorderingType heuristic_local;
  DdManager *table_local;
  
  if (table->keys - table->dead < (uint)minsize) {
    table_local._4_4_ = 1;
  }
  else {
    hook._4_4_ = heuristic;
    if (heuristic == CUDD_REORDER_SAME) {
      hook._4_4_ = table->autoMethod;
    }
    if (hook._4_4_ == CUDD_REORDER_NONE) {
      table_local._4_4_ = 1;
    }
    else {
      table->reorderings = table->reorderings + 1;
      pvVar4 = (void *)Extra_CpuTime();
      for (_nextDyn = table->preReorderingHook; _nextDyn != (DdHook *)0x0; _nextDyn = _nextDyn->next
          ) {
        iVar2 = (*_nextDyn->f)(table,"BDD",(void *)hook._4_4_);
        if (iVar2 == 0) {
          return 0;
        }
      }
      iVar2 = ddReorderPreprocess(table);
      if (iVar2 == 0) {
        table_local._4_4_ = 0;
      }
      else {
        ddTotalNumberSwapping = 0;
        if (table->peakLiveNodes < table->keys) {
          table->peakLiveNodes = table->keys;
        }
        if ((table->reordCycle == 0) || (table->reorderings % table->reordCycle != 0)) {
          localTime._4_4_ = cuddTreeSifting(table,hook._4_4_);
        }
        else {
          dVar1 = table->maxGrowth;
          table->maxGrowth = table->maxGrowthAlt;
          localTime._4_4_ = cuddTreeSifting(table,hook._4_4_);
          table->maxGrowth = dVar1;
        }
        if (localTime._4_4_ == 0) {
          table_local._4_4_ = 0;
        }
        else {
          iVar2 = ddReorderPostprocess(table);
          if (iVar2 == 0) {
            table_local._4_4_ = 0;
          }
          else if ((table->realign == 0) || (iVar2 = cuddZddAlignToBdd(table), iVar2 != 0)) {
            uVar3 = ((table->keys - (table->constants).keys) + 1) * 2 + (table->constants).keys;
            if ((table->reorderings < 0x14) || (table->nextDyn < uVar3)) {
              table->nextDyn = uVar3;
            }
            else {
              table->nextDyn = table->nextDyn + 0x14;
            }
            table->reordered = 1;
            for (_nextDyn = table->postReorderingHook; _nextDyn != (DdHook *)0x0;
                _nextDyn = _nextDyn->next) {
              iVar2 = (*_nextDyn->f)(table,"BDD",pvVar4);
              if (iVar2 == 0) {
                return 0;
              }
            }
            aVar5 = Extra_CpuTime();
            table->reordTime = (aVar5 - (long)pvVar4) + table->reordTime;
            table_local._4_4_ = localTime._4_4_;
          }
          else {
            table_local._4_4_ = 0;
          }
        }
      }
    }
  }
  return table_local._4_4_;
}

Assistant:

int
Cudd_ReduceHeap(
  DdManager * table /* DD manager */,
  Cudd_ReorderingType heuristic /* method used for reordering */,
  int  minsize /* bound below which no reordering occurs */)
{
    DdHook *hook;
    int result;
    unsigned int nextDyn;
#ifdef DD_STATS
    unsigned int initialSize;
    unsigned int finalSize;
#endif
    long localTime;

    /* Don't reorder if there are too many dead nodes. */
    if (table->keys - table->dead < (unsigned) minsize)
        return(1);

    if (heuristic == CUDD_REORDER_SAME) {
        heuristic = table->autoMethod;
    }
    if (heuristic == CUDD_REORDER_NONE) {
        return(1);
    }

    /* This call to Cudd_ReduceHeap does initiate reordering. Therefore
    ** we count it.
    */
    table->reorderings++;

    localTime = util_cpu_time();

    /* Run the hook functions. */
    hook = table->preReorderingHook;
    while (hook != NULL) {
        int res = (hook->f)(table, "BDD", (void *)heuristic);
        if (res == 0) return(0);
        hook = hook->next;
    }

    if (!ddReorderPreprocess(table)) return(0);
    ddTotalNumberSwapping = 0;

    if (table->keys > table->peakLiveNodes) {
        table->peakLiveNodes = table->keys;
    }
#ifdef DD_STATS
    initialSize = table->keys - table->isolated;
    ddTotalNISwaps = 0;

    switch(heuristic) {
    case CUDD_REORDER_RANDOM:
    case CUDD_REORDER_RANDOM_PIVOT:
        (void) fprintf(table->out,"#:I_RANDOM  ");
        break;
    case CUDD_REORDER_SIFT:
    case CUDD_REORDER_SIFT_CONVERGE:
    case CUDD_REORDER_SYMM_SIFT:
    case CUDD_REORDER_SYMM_SIFT_CONV:
    case CUDD_REORDER_GROUP_SIFT:
    case CUDD_REORDER_GROUP_SIFT_CONV:
        (void) fprintf(table->out,"#:I_SIFTING ");
        break;
    case CUDD_REORDER_WINDOW2:
    case CUDD_REORDER_WINDOW3:
    case CUDD_REORDER_WINDOW4:
    case CUDD_REORDER_WINDOW2_CONV:
    case CUDD_REORDER_WINDOW3_CONV:
    case CUDD_REORDER_WINDOW4_CONV:
        (void) fprintf(table->out,"#:I_WINDOW  ");
        break;
    case CUDD_REORDER_ANNEALING:
        (void) fprintf(table->out,"#:I_ANNEAL  ");
        break;
    case CUDD_REORDER_GENETIC:
        (void) fprintf(table->out,"#:I_GENETIC ");
        break;
    case CUDD_REORDER_LINEAR:
    case CUDD_REORDER_LINEAR_CONVERGE:
        (void) fprintf(table->out,"#:I_LINSIFT ");
        break;
    case CUDD_REORDER_EXACT:
        (void) fprintf(table->out,"#:I_EXACT   ");
        break;
    default:
        return(0);
    }
    (void) fprintf(table->out,"%8d: initial size",initialSize);
#endif

    /* See if we should use alternate threshold for maximum growth. */
    if (table->reordCycle && table->reorderings % table->reordCycle == 0) {
        double saveGrowth = table->maxGrowth;
        table->maxGrowth = table->maxGrowthAlt;
        result = cuddTreeSifting(table,heuristic);
        table->maxGrowth = saveGrowth;
    } else {
        result = cuddTreeSifting(table,heuristic);
    }

#ifdef DD_STATS
    (void) fprintf(table->out,"\n");
    finalSize = table->keys - table->isolated;
    (void) fprintf(table->out,"#:F_REORDER %8d: final size\n",finalSize);
    (void) fprintf(table->out,"#:T_REORDER %8g: total time (sec)\n",
                   ((double)(util_cpu_time() - localTime)/1000.0));
    (void) fprintf(table->out,"#:N_REORDER %8d: total swaps\n",
                   ddTotalNumberSwapping);
    (void) fprintf(table->out,"#:M_REORDER %8d: NI swaps\n",ddTotalNISwaps);
#endif

    if (result == 0)
        return(0);

    if (!ddReorderPostprocess(table))
        return(0);

    if (table->realign) {
        if (!cuddZddAlignToBdd(table))
            return(0);
    }

    nextDyn = (table->keys - table->constants.keys + 1) *
              DD_DYN_RATIO + table->constants.keys;
    if (table->reorderings < 20 || nextDyn > table->nextDyn)
        table->nextDyn = nextDyn;
    else
        table->nextDyn += 20;
    table->reordered = 1;

    /* Run hook functions. */
    hook = table->postReorderingHook;
    while (hook != NULL) {
        int res = (hook->f)(table, "BDD", (void *)localTime);
        if (res == 0) return(0);
        hook = hook->next;
    }
    /* Update cumulative reordering time. */
    table->reordTime += util_cpu_time() - localTime;

    return(result);

}